

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O3

bool __thiscall
QPlainTextEditSearchWidget::doSearch
          (QPlainTextEditSearchWidget *this,bool searchDown,bool allowRestartAtTop,bool updateUI)

{
  undefined8 uVar1;
  QString *pQVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  undefined4 uVar7;
  int extraout_var;
  QMargins *pQVar8;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  MoveMode MVar9;
  int iVar10;
  QByteArrayView QVar11;
  QString t_1;
  QString t_2;
  QString t_3;
  QString text;
  QString t;
  QMargins margins;
  QRegularExpression local_128;
  char16_t *pcStack_120;
  undefined8 local_118;
  undefined4 local_10c;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> local_108;
  char16_t *pcStack_100;
  undefined8 local_f8;
  undefined4 local_ec;
  QArrayData *local_e8;
  char16_t *local_e0;
  undefined8 uStack_d8;
  QArrayData *local_d0;
  char16_t *local_c8;
  undefined8 uStack_c0;
  QArrayData *local_b8;
  char16_t *local_b0;
  undefined8 uStack_a8;
  QArrayData *local_a0 [2];
  long local_90;
  QArrayData *local_88;
  char16_t *local_80;
  undefined8 local_78;
  QArrayData *local_70;
  char16_t *local_68;
  undefined8 local_60;
  QArrayData *local_58;
  char16_t *local_50;
  undefined8 uStack_48;
  undefined1 local_40 [16];
  
  cVar4 = QTimer::isActive();
  if (cVar4 != '\0') {
    stopDebounce(this);
  }
  QLineEdit::text();
  if (local_90 == 0) {
    if (updateUI) {
      pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
      QVar11.m_data = (storage_type *)0x0;
      QVar11.m_size = (qsizetype)&local_128;
      QString::fromLatin1(QVar11);
      local_108 = local_128.d.d;
      pcStack_100 = pcStack_120;
      local_f8 = local_118;
      QWidget::setStyleSheet(pQVar2);
      if ((QArrayData *)local_108.d != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_108.d)->field_0x0)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_108.d)->field_0x0)->_q_value).super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_108.d)->field_0x0)->_q_value).super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate((QArrayData *)local_108.d,2,8);
        }
      }
    }
    bVar5 = 0;
  }
  else {
    iVar6 = QComboBox::currentIndex();
    local_ec = (undefined4)CONCAT71(in_register_00000011,allowRestartAtTop);
    local_10c = (undefined4)CONCAT71(in_register_00000009,updateUI);
    bVar5 = QAbstractButton::isChecked();
    cVar4 = !searchDown + '\x04';
    if (iVar6 != 1) {
      cVar4 = !searchDown;
    }
    cVar3 = cVar4 + '\x02';
    if (bVar5 == 0) {
      cVar3 = cVar4;
    }
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
    uVar1 = *(undefined8 *)(this + 0x88);
    if (iVar6 == 2) {
      QRegularExpression::QRegularExpression(&local_128,local_a0,bVar5 ^ 1);
      cVar4 = QPlainTextEdit::find(uVar1,&local_128,cVar3);
      QRegularExpression::~QRegularExpression(&local_128);
    }
    else {
      cVar4 = QPlainTextEdit::find(uVar1,local_a0,cVar3);
    }
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
    if (cVar4 == '\0') {
      if ((char)local_ec == '\0') {
        bVar5 = 0;
      }
      else {
        MVar9 = 0xb;
        if (searchDown) {
          MVar9 = KeepAnchor;
        }
        QPlainTextEdit::moveCursor((MoveOperation)*(undefined8 *)(this + 0x88),MVar9);
        uVar1 = *(undefined8 *)(this + 0x88);
        if (iVar6 == 2) {
          QRegularExpression::QRegularExpression(&local_128,local_a0,bVar5 ^ 1);
          bVar5 = QPlainTextEdit::find(uVar1,&local_128,cVar3);
          QRegularExpression::~QRegularExpression(&local_128);
        }
        else {
          bVar5 = QPlainTextEdit::find(uVar1,local_a0,cVar3);
        }
        if ((bVar5 & (byte)local_10c) == 1) {
          uVar7 = 1;
          if (!searchDown) {
            uVar7 = *(undefined4 *)(this + 0x30);
          }
          *(undefined4 *)(this + 0x34) = uVar7;
          bVar5 = 1;
          updateSearchCountLabelText(this);
        }
      }
    }
    else {
      iVar6 = (searchDown - 1 | 1) + *(int *)(this + 0x34);
      if (*(int *)(this + 0x30) < iVar6) {
        iVar6 = *(int *)(this + 0x30);
      }
      *(int *)(this + 0x34) = iVar6;
      bVar5 = 1;
      updateSearchCountLabelText(this);
    }
    if ((byte)local_10c != '\0') {
      QPlainTextEdit::cursorRect();
      QWidget::layout();
      local_40 = QLayout::contentsMargins();
      iVar10 = *(int *)(*(long *)(this + 0x20) + 0x20) - *(int *)(*(long *)(this + 0x20) + 0x18);
      iVar6 = 0;
      if (*(int *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x20) -
          (*(int *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x18) + iVar10) < extraout_var) {
        iVar6 = iVar10 + 0xb;
      }
      if (iVar6 != local_40._12_4_) {
        local_40._12_4_ = iVar6;
        pQVar8 = (QMargins *)QWidget::layout();
        QLayout::setContentsMargins(pQVar8);
      }
      local_128.d.d =
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)(QRegularExpressionPrivate *)0x0
      ;
      if (this[0x90] == (QPlainTextEditSearchWidget)0x1) {
        pcStack_120 = L"#8d2b36";
        if (bVar5 != 0) {
          pcStack_120 = L"#135a13";
        }
        pcStack_100 = L"#cccccc";
      }
      else {
        pcStack_120 = L"#FAE9EB";
        if (bVar5 != 0) {
          pcStack_120 = L"#D5FAE2";
        }
        pcStack_100 = L"#404040";
      }
      local_118 = 7;
      local_108.d = (QRegularExpressionPrivate *)0x0;
      local_f8 = 7;
      pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
      local_58 = (QArrayData *)0x0;
      local_50 = L"* { background: ";
      uStack_48 = 0x10;
      QString::append((QString *)&local_58);
      local_70 = (QArrayData *)0x0;
      local_68 = L"; color: ";
      local_60 = 9;
      local_e8 = local_58;
      local_e0 = local_50;
      uStack_d8 = uStack_48;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_e8);
      local_d0 = local_e8;
      local_c8 = local_e0;
      uStack_c0 = uStack_d8;
      if (local_e8 != (QArrayData *)0x0) {
        LOCK();
        (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_d0);
      local_88 = (QArrayData *)0x0;
      local_80 = L"; }";
      local_78 = 3;
      local_b8 = local_d0;
      local_b0 = local_c8;
      uStack_a8 = uStack_c0;
      if (local_d0 != (QArrayData *)0x0) {
        LOCK();
        (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_b8);
      QWidget::setStyleSheet(pQVar2);
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,8);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,8);
        }
      }
      if (local_d0 != (QArrayData *)0x0) {
        LOCK();
        (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_d0,2,8);
        }
      }
      if (local_e8 != (QArrayData *)0x0) {
        LOCK();
        (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e8,2,8);
        }
      }
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,2,8);
        }
      }
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,8);
        }
      }
      QPlainTextEdit::setExtraSelections(*(QList **)(this + 0x88));
      if ((QArrayData *)local_108.d != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_108.d)->field_0x0)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_108.d)->field_0x0)->_q_value).super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_108.d)->field_0x0)->_q_value).super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate((QArrayData *)local_108.d,2,8);
        }
      }
      if (local_128.d.d != (QRegularExpressionPrivate *)0x0) {
        LOCK();
        *(int *)local_128.d.d = *(int *)local_128.d.d + -1;
        UNLOCK();
        if (*(int *)local_128.d.d == 0) {
          QArrayData::deallocate((QArrayData *)local_128.d.d,2,8);
        }
      }
    }
  }
  if (local_a0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0[0],2,8);
    }
  }
  return (bool)bVar5;
}

Assistant:

bool QPlainTextEditSearchWidget::doSearch(bool searchDown,
                                          bool allowRestartAtTop,
                                          bool updateUI) {
    if (_debounceTimer.isActive()) {
        stopDebounce();
    }

    const QString text = ui->searchLineEdit->text();

    if (text.isEmpty()) {
        if (updateUI) {
            ui->searchLineEdit->setStyleSheet(QLatin1String(""));
        }

        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    const bool caseSensitive = ui->matchCaseSensitiveButton->isChecked();

    QFlags<QTextDocument::FindFlag> options =
        searchDown ? QTextDocument::FindFlag(0) : QTextDocument::FindBackward;
    if (searchMode == WholeWordsMode) {
        options |= QTextDocument::FindWholeWords;
    }

    if (caseSensitive) {
        options |= QTextDocument::FindCaseSensitively;
    }

    // block signal to reduce too many signals being fired and too many updates
    _textEdit->blockSignals(true);

    bool found =
        searchMode == RegularExpressionMode
            ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
            _textEdit->find(
                QRegularExpression(
                    text, caseSensitive
                              ? QRegularExpression::NoPatternOption
                              : QRegularExpression::CaseInsensitiveOption),
                options)
            :
#else
            _textEdit->find(QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                        : Qt::CaseInsensitive),
                            options)
            :
#endif
            _textEdit->find(text, options);

    _textEdit->blockSignals(false);

    if (found) {
        const int result =
            searchDown ? ++_currentSearchResult : --_currentSearchResult;
        _currentSearchResult = std::min(result, _searchResultCount);

        updateSearchCountLabelText();
    }

    // start at the top (or bottom) if not found
    if (!found && allowRestartAtTop) {
        _textEdit->moveCursor(searchDown ? QTextCursor::Start
                                         : QTextCursor::End);
        found =
            searchMode == RegularExpressionMode
                ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
                _textEdit->find(
                    QRegularExpression(
                        text, caseSensitive
                                  ? QRegularExpression::NoPatternOption
                                  : QRegularExpression::CaseInsensitiveOption),
                    options)
                :
#else
                _textEdit->find(
                    QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                : Qt::CaseInsensitive),
                    options)
                :
#endif
                _textEdit->find(text, options);

        if (found && updateUI) {
            _currentSearchResult = searchDown ? 1 : _searchResultCount;
            updateSearchCountLabelText();
        }
    }

    if (updateUI) {
        const QRect rect = _textEdit->cursorRect();
        QMargins margins = _textEdit->layout()->contentsMargins();
        const int searchWidgetHotArea = _textEdit->height() - this->height();
        const int marginBottom =
            (rect.y() > searchWidgetHotArea) ? (this->height() + 10) : 0;

        // move the search box a bit up if we would block the search result
        if (margins.bottom() != marginBottom) {
            margins.setBottom(marginBottom);
            _textEdit->layout()->setContentsMargins(margins);
        }

        // add a background color according if we found the text or not
        const QString bgColorCode =
            _darkMode
                ? (found ? QStringLiteral("#135a13")
                         : QStringLiteral("#8d2b36"))
                : found ? QStringLiteral("#D5FAE2") : QStringLiteral("#FAE9EB");
        const QString fgColorCode =
            _darkMode ? QStringLiteral("#cccccc") : QStringLiteral("#404040");

        ui->searchLineEdit->setStyleSheet(
            QStringLiteral("* { background: ") + bgColorCode +
            QStringLiteral("; color: ") + fgColorCode + QStringLiteral("; }"));

        // restore the search extra selections after the find command
        this->setSearchExtraSelections();
    }

    return found;
}